

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_bclr_8_r_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint addr_in;
  uint uVar3;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar2 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(uVar2);
  }
  uVar1 = m68k_read_memory_16(uVar2 & m68ki_cpu.address_mask);
  addr_in = (uint)(short)uVar1;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar2 = addr_in;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(addr_in);
  }
  uVar1 = m68k_read_memory_8(uVar2 & m68ki_cpu.address_mask);
  uVar3 = 1 << (*(byte *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c)) & 7);
  m68ki_cpu.not_z_flag = uVar3 & uVar1;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_8(addr_in & m68ki_cpu.address_mask,uVar1 & ~uVar3);
  return;
}

Assistant:

static void m68k_op_bclr_8_r_aw(void)
{
	uint ea = EA_AW_8();
	uint src = m68ki_read_8(ea);
	uint mask = 1 << (DX & 7);

	FLAG_Z = src & mask;
	m68ki_write_8(ea, src & ~mask);
}